

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O3

bool __thiscall Jinx::Variant::ConvertTo(Variant *this,ValueType type)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Guid *in_RDX;
  double dVar4;
  ValueType VVar5;
  undefined4 in_register_00000034;
  ulong uVar6;
  size_t sVar7;
  double number;
  String local_58;
  Allocator<char> local_31;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  *local_30;
  
  VVar5 = this->m_type;
  bVar1 = true;
  if (VVar5 == type) {
    return true;
  }
  if (type == Null) goto LAB_001135aa;
  switch(VVar5) {
  case Null:
    switch(type) {
    case Number:
      Destroy(this);
      this->m_type = Number;
      break;
    case Integer:
      Destroy(this);
      this->m_type = Integer;
      break;
    case Boolean:
      Destroy(this);
      this->m_type = Boolean;
      (this->field_1).m_boolean = false;
      return true;
    case String:
      local_58.field_2._M_allocated_capacity._0_4_ = 0x6c6c756e;
      local_58._M_string_length = 4;
      local_58.field_2._M_allocated_capacity._4_4_ =
           local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      SetString(this,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return true;
      }
      goto LAB_0011368f;
    default:
      goto switchD_001133cd_caseD_6;
    }
    (this->field_1).m_number = 0.0;
    return true;
  case Number:
    if (type == String) {
      Impl::NumberToString_abi_cxx11_
                (&local_58,(Impl *)CONCAT44(in_register_00000034,type),(this->field_1).m_number);
      SetString(this,&local_58);
LAB_00113680:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return true;
      }
LAB_0011368f:
      std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_destroy
                (&local_58,
                 CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                          local_58.field_2._M_allocated_capacity._0_4_));
      return true;
    }
    if (type == Boolean) {
      dVar4 = (this->field_1).m_number;
      Destroy(this);
      this->m_type = Boolean;
      (this->field_1).m_boolean = dVar4 != 0.0;
      return true;
    }
    if (type == Integer) {
      uVar6 = (ulong)(this->field_1).m_number;
LAB_0011364d:
      Destroy(this);
      this->m_type = Integer;
      *(ulong *)&this->field_1 = uVar6;
      return true;
    }
    break;
  case Integer:
    if (type == String) {
      Impl::IntegerToString_abi_cxx11_
                (&local_58,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(int64_t)in_RDX);
      SetString(this,&local_58);
      goto LAB_00113680;
    }
    if (type == Boolean) {
      sVar7 = (this->field_1).m_integer;
      goto LAB_001135cc;
    }
    if (type == Number) {
      local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                  *)(double)(this->field_1).m_integer;
LAB_00113804:
      Destroy(this);
      this->m_type = Number;
      (this->field_1).m_number = (double)local_30;
      return true;
    }
    break;
  case Boolean:
    if (type == String) {
      Impl::BooleanToString_abi_cxx11_
                (&local_58,(Impl *)(ulong)(this->field_1).m_boolean,SUB81(in_RDX,0));
      SetString(this,&local_58);
      goto LAB_00113680;
    }
    if (type == Integer) {
      uVar6 = (ulong)(this->field_1).m_boolean;
      goto LAB_0011364d;
    }
    if (type == Number) {
      if ((this->field_1).m_boolean == false) {
        local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                    *)0x0;
      }
      else {
        local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                    *)0x3ff0000000000000;
      }
      goto LAB_00113804;
    }
    break;
  case String:
    switch(type) {
    case Number:
      bVar1 = Impl::StringToNumber(&(this->field_1).m_string,(double *)&local_58,International);
      if (bVar1) {
        local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
                    *)local_58._M_dataplus._M_p;
        Destroy(this);
        (this->field_1).m_integer = (int64_t)local_30;
        VVar5 = Number;
        goto LAB_0011387f;
      }
      dVar4 = (this->field_1).m_number;
      pcVar2 = "Error converting string %s to number";
      break;
    case Integer:
      bVar1 = Impl::StringToInteger(&(this->field_1).m_string,(int64_t *)&local_58);
      if (bVar1) {
        Destroy(this);
        (this->field_1).m_integer = (int64_t)local_58._M_dataplus._M_p;
        VVar5 = Integer;
        goto LAB_0011387f;
      }
      dVar4 = (this->field_1).m_number;
      pcVar2 = "Error converting string %s to integer";
      break;
    case Boolean:
      bVar1 = Impl::StringToBoolean(&(this->field_1).m_string,(bool *)&local_58);
      if (bVar1) {
        Destroy(this);
        (this->field_1).m_boolean = local_58._M_dataplus._M_p._0_1_;
        VVar5 = Boolean;
        goto LAB_0011387f;
      }
      dVar4 = (this->field_1).m_number;
      pcVar2 = "Error converting string %s to boolean";
      break;
    default:
      goto switchD_001133cd_caseD_6;
    case Collection:
      CreateCollection();
      bVar1 = Impl::StringToCollection(&(this->field_1).m_string,(CollectionPtr *)&local_58);
      if (bVar1) {
        SetCollection(this,(CollectionPtr *)&local_58);
      }
      else {
        Impl::LogWriteLine(Error,"Error converting string to collection type",
                           (this->field_1).m_collection.
                           super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr);
        Destroy(this);
        this->m_type = Null;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        return bVar1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._M_string_length);
      return bVar1;
    case Guid:
      bVar1 = Impl::StringToGuid(&(this->field_1).m_string,(Guid *)&local_58);
      if (bVar1) {
        Destroy(this);
        (this->field_1).m_integer = (int64_t)local_58._M_dataplus._M_p;
        (this->field_1).m_string._M_string_length = local_58._M_string_length;
        VVar5 = Guid;
        goto LAB_0011387f;
      }
      dVar4 = (this->field_1).m_number;
      pcVar2 = "Error converting string %s to Guid";
      break;
    case ValType:
      bVar1 = Impl::StringToValueType(&(this->field_1).m_string,(ValueType *)&local_58);
      if (bVar1) {
        Destroy(this);
        (this->field_1).m_valType = (ValueType)local_58._M_dataplus._M_p;
        VVar5 = ValType;
        goto LAB_0011387f;
      }
      dVar4 = (this->field_1).m_number;
      pcVar2 = "Error converting string %s to value type";
    }
    VVar5 = Null;
    Impl::LogWriteLine(Error,pcVar2,dVar4);
    Destroy(this);
LAB_0011387f:
    this->m_type = VVar5;
    return bVar1;
  case Collection:
    if (type == Boolean) {
      sVar7 = (((this->field_1).m_collection.
                super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
LAB_001135cc:
      Destroy(this);
      this->m_type = Boolean;
      (this->field_1).m_boolean = sVar7 != 0;
      return true;
    }
    break;
  case Function:
    if (type == String) {
      Impl::UnsignedIntegerToString_abi_cxx11_
                (&local_58,
                 (Impl *)(this->field_1).m_collection.
                         super___shared_ptr<std::map<Jinx::Variant,_Jinx::Variant,_std::less<Jinx::Variant>,_Jinx::Allocator<std::pair<const_Jinx::Variant,_Jinx::Variant>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,(uint64_t)in_RDX);
      SetString(this,&local_58);
      goto LAB_00113680;
    }
    break;
  case Guid:
    if (type == String) {
      Impl::GuidToString_abi_cxx11_(&local_58,(Impl *)&(this->field_1).m_string,in_RDX);
      SetString(this,&local_58);
      goto LAB_00113680;
    }
    break;
  case ValType:
    if (type == String) {
      pcVar2 = Impl::GetValueTypeName((this->field_1).m_valType);
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      basic_string<Jinx::Allocator<char>>
                ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_58,pcVar2
                 ,&local_31);
      SetString(this,&local_58);
      goto LAB_00113680;
    }
  }
switchD_001133cd_caseD_6:
  pcVar2 = Impl::GetValueTypeName(VVar5);
  pcVar3 = Impl::GetValueTypeName(type);
  bVar1 = false;
  Impl::LogWriteLine(Error,"Error converting %s to %s",pcVar2,pcVar3);
LAB_001135aa:
  Destroy(this);
  this->m_type = Null;
  return bVar1;
}

Assistant:

inline_t bool Variant::ConvertTo(ValueType type)
	{
		if (m_type == type)
			return true;
		if (type == ValueType::Null)
		{
			SetNull();
			return true;
		}

		switch (m_type)
		{
			case ValueType::Null:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::NullToNumber());
						return true;
					case ValueType::Integer:
						SetInteger(Impl::NullToInteger());
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NullToBoolean());
						return true;
					case ValueType::String:
						SetString(Impl::NullToString());
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Number:
			{
				switch (type)
				{
					case ValueType::Integer:
						SetInteger(Impl::NumberToInteger(m_number));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::NumberToBoolean(m_number));
						return true;
					case ValueType::String:
						SetString(Impl::NumberToString(m_number));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Integer:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::IntegerToNumber(m_integer));
						return true;
					case ValueType::Boolean:
						SetBoolean(Impl::IntegerToBoolean(m_integer));
						return true;
					case ValueType::String:
						SetString(Impl::IntegerToString(m_integer));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::Boolean:
			{
				switch (type)
				{
					case ValueType::Number:
						SetNumber(Impl::BooleanToNumber(m_boolean));
						return true;
					case ValueType::Integer:
						SetInteger(Impl::BooleanToInteger(m_boolean));
						return true;
					case ValueType::String:
						SetString(Impl::BooleanToString(m_boolean));
						return true;
					default:
						break;
				};
			}
			break;
			case ValueType::String:
			{
				switch (type)
				{
					case ValueType::Number:
					{
						double number;
						if (!Impl::StringToNumber(m_string, &number))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to number", m_string.c_str());
							SetNull();
							return false;
						}
						SetNumber(number);
						return true;
					}
					case ValueType::Integer:
					{
						int64_t integer;
						if (!Impl::StringToInteger(m_string, &integer))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to integer", m_string.c_str());
							SetNull();
							return false;
						}
						SetInteger(integer);
						return true;
					}
					case ValueType::Boolean:
					{
						bool boolean;
						if (!Impl::StringToBoolean(m_string, &boolean))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to boolean", m_string.c_str());
							SetNull();
							return false;
						}
						SetBoolean(boolean);
						return true;
					}
					case ValueType::Collection:
					{
						auto collection = CreateCollection();
						if (!Impl::StringToCollection(m_string, &collection))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string to collection type", m_string.c_str());
							SetNull();
							return false;
						}
						SetCollection(collection);
						return true;
					}
					case ValueType::Guid:
					{
						Guid guid;
						if (!Impl::StringToGuid(m_string, &guid))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to Guid", m_string.c_str());
							SetNull();
							return false;
						}
						SetGuid(guid);
						return true;
					}
					case ValueType::ValType:
					{
						ValueType valType;
						if (!Impl::StringToValueType(m_string, &valType))
						{
							Impl::LogWriteLine(LogLevel::Error, "Error converting string %s to value type", m_string.c_str());
							SetNull();
							return false;
						}
						SetValType(valType);
						return true;
					}
					default:
						break;
				};
			}
			break;
			case ValueType::Function:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::UnsignedIntegerToString(m_function));
						return true;
					default:
						break;
				};
				break;
			case ValueType::Collection:
				switch (type)
				{
					case ValueType::Boolean:
						SetBoolean(!m_collection->empty());
						return true;
					default:
						break;
				};
				break;
			case ValueType::Guid:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GuidToString(m_guid));
						return true;
					default:
						break;
				};
				break;
			case ValueType::ValType:
				switch (type)
				{
					case ValueType::String:
						SetString(Impl::GetValueTypeName(m_valType));
						return true;
					default:
						break;
				};
				break;
			default:
				break;
		};
		Impl::LogWriteLine(LogLevel::Error, "Error converting %s to %s", Impl::GetValueTypeName(m_type), Impl::GetValueTypeName(type));
		SetNull();
		return false;
	}